

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O2

Vec3fa __thiscall embree::XMLLoader::load<embree::Vec3fa>(XMLLoader *this,Ref<embree::XML> *xml)

{
  Token *this_00;
  undefined4 uVar1;
  undefined4 uVar3;
  runtime_error *this_01;
  long *in_RDX;
  float fVar4;
  float fVar5;
  undefined4 extraout_XMM0_Db;
  Vec3fa VVar6;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  undefined1 auVar2 [16];
  
  this_00 = *(Token **)(*in_RDX + 0x98);
  if (*(long *)(*in_RDX + 0xa0) - (long)this_00 == 0xd8) {
    fVar4 = Token::Float(this_00,true);
    fVar5 = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x48),true);
    VVar6.field_0._0_4_ = Token::Float((Token *)(*(long *)(*in_RDX + 0x98) + 0x90),true);
    uVar3 = fVar5;
    uVar1 = fVar4;
    auVar2._0_8_ = CONCAT44(uVar3,uVar1);
    auVar2._8_4_ = VVar6.field_0._0_4_;
    auVar2._12_4_ = 0;
    (this->path).filename._M_dataplus = (_Alloc_hider)auVar2._0_8_;
    (this->path).filename._M_string_length = auVar2._8_8_;
    VVar6.field_0.m128[1] = (float)extraout_XMM0_Db;
    VVar6.field_0.m128[2] = VVar6.field_0._0_4_;
    VVar6.field_0.m128[3] = 0.0;
    return (Vec3fa)VVar6.field_0;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParseLocation::str_abi_cxx11_(&local_58,(ParseLocation *)(*in_RDX + 0x10));
  std::operator+(&local_38,&local_58,": wrong float3 body");
  std::runtime_error::runtime_error(this_01,(string *)&local_38);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Vec3fa XMLLoader::load<Vec3fa>(const Ref<XML>& xml) {
    if (xml->body.size() != 3) THROW_RUNTIME_ERROR(xml->loc.str()+": wrong float3 body");
    return Vec3fa(xml->body[0].Float(),xml->body[1].Float(),xml->body[2].Float());
  }